

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Gia_ManSimplifyXor(Vec_Int_t *vSuper)

{
  int iVar1;
  undefined4 local_24;
  int fCompl;
  int This;
  int Prev;
  int k;
  int i;
  Vec_Int_t *vSuper_local;
  
  This = 0;
  fCompl = -1;
  local_24 = 0;
  for (Prev = 0; iVar1 = Vec_IntSize(vSuper), Prev < iVar1; Prev = Prev + 1) {
    iVar1 = Vec_IntEntry(vSuper,Prev);
    if (iVar1 != 0) {
      if (iVar1 == 1) {
        local_24 = local_24 ^ 1;
      }
      else if (fCompl == iVar1) {
        fCompl = -1;
        This = This + -1;
      }
      else {
        Vec_IntWriteEntry(vSuper,This,iVar1);
        fCompl = iVar1;
        This = This + 1;
      }
    }
  }
  Vec_IntShrink(vSuper,This);
  iVar1 = Vec_IntSize(vSuper);
  if (iVar1 == 0) {
    Vec_IntPush(vSuper,local_24);
  }
  else if (local_24 != 0) {
    iVar1 = Vec_IntEntry(vSuper,0);
    iVar1 = Abc_LitNot(iVar1);
    Vec_IntWriteEntry(vSuper,0,iVar1);
  }
  return;
}

Assistant:

void Gia_ManSimplifyXor( Vec_Int_t * vSuper )
{
    int i, k = 0, Prev = -1, This, fCompl = 0;
    Vec_IntForEachEntry( vSuper, This, i )
    {
        if ( This == 0 )
            continue;
        if ( This == 1 )
            fCompl ^= 1; 
        else if ( Prev != This )
            Vec_IntWriteEntry( vSuper, k++, This ), Prev = This;
        else
            Prev = -1, k--;
    }
    Vec_IntShrink( vSuper, k );
    if ( Vec_IntSize( vSuper ) == 0 )
        Vec_IntPush( vSuper, fCompl );
    else if ( fCompl )
        Vec_IntWriteEntry( vSuper, 0, Abc_LitNot(Vec_IntEntry(vSuper, 0)) );
}